

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentId::ON_SubDComponentId(ON_SubDComponentId *this,ON_SubDComponentPtr cptr)

{
  Type TVar1;
  ON_SubDComponentPtr local_18;
  
  this->m_id = 0;
  this->m_type_and_dir = '\0';
  this->m_valueAB[0] = '\0';
  this->m_valueAB[1] = '\0';
  this->m_valueAB[2] = '\0';
  if ((cptr.m_ptr & 0xfffffffffffffff8) != 0 && (cptr.m_ptr & 6) != 0) {
    this->m_id = *(uint *)((cptr.m_ptr & 0xfffffffffffffff8) + 8);
    local_18.m_ptr = cptr.m_ptr;
    TVar1 = ON_SubDComponentPtr::ComponentType(&local_18);
    this->m_type_and_dir = (Type)cptr.m_ptr & 1 | TVar1 & Face;
  }
  return;
}

Assistant:

ON_SubDComponentId::ON_SubDComponentId(ON_SubDComponentPtr cptr)
{
  const ON_SubDComponentBase* b = cptr.ComponentBase();
  if (nullptr != b)
  {
    m_id = b->m_id;
    Internal_SetType(cptr.ComponentType());
    Internal_SetDir(0 == cptr.ComponentDirection() ? 0u : 1u);
  }
}